

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode DiagnosticInfo_decodeBinary(UA_DiagnosticInfo *dst,UA_DataType *_)

{
  UA_StatusCode UVar1;
  char *pcVar2;
  uint local_28;
  byte local_21;
  UA_StatusCode retval;
  UA_Byte encodingMask;
  UA_DataType *__local;
  UA_DiagnosticInfo *dst_local;
  
  _retval = _;
  __local = (UA_DataType *)dst;
  local_28 = Byte_decodeBinary(&local_21,(UA_DataType *)0x0);
  dst_local._4_4_ = local_28;
  if (local_28 == 0) {
    if ((local_21 & 1) != 0) {
      *(byte *)&__local->typeName = *(byte *)&__local->typeName & 0xfe | 1;
      local_28 = Int32_decodeBinary((UA_Int32 *)((long)&__local->typeName + 4));
    }
    if ((local_21 & 2) != 0) {
      *(byte *)&__local->typeName = *(byte *)&__local->typeName & 0xfd | 2;
      UVar1 = Int32_decodeBinary((UA_Int32 *)&__local->typeId);
      local_28 = UVar1 | local_28;
    }
    if ((local_21 & 4) != 0) {
      *(byte *)&__local->typeName = *(byte *)&__local->typeName & 0xfb | 4;
      UVar1 = Int32_decodeBinary((UA_Int32 *)&(__local->typeId).identifierType);
      local_28 = UVar1 | local_28;
    }
    if ((local_21 & 8) != 0) {
      *(byte *)&__local->typeName = *(byte *)&__local->typeName & 0xf7 | 8;
      UVar1 = Int32_decodeBinary((UA_Int32 *)&(__local->typeId).identifier.numeric);
      local_28 = UVar1 | local_28;
    }
    if ((local_21 & 0x10) != 0) {
      *(byte *)&__local->typeName = *(byte *)&__local->typeName & 0xef | 0x10;
      UVar1 = String_decodeBinary((UA_String *)((long)&(__local->typeId).identifier + 8),
                                  (UA_DataType *)0x0);
      local_28 = UVar1 | local_28;
    }
    if ((local_21 & 0x20) != 0) {
      *(byte *)&__local->typeName = *(byte *)&__local->typeName & 0xdf | 0x20;
      UVar1 = StatusCode_decodeBinary((UA_StatusCode *)&__local->members);
      local_28 = UVar1 | local_28;
    }
    if ((local_21 & 0x40) != 0) {
      pcVar2 = (char *)calloc(1,0x38);
      __local[1].typeName = pcVar2;
      if (__local[1].typeName == (char *)0x0) {
        return 0x80030000;
      }
      *(byte *)&__local->typeName = *(byte *)&__local->typeName & 0xbf | 0x40;
      UVar1 = DiagnosticInfo_decodeBinary
                        ((UA_DiagnosticInfo *)__local[1].typeName,(UA_DataType *)0x0);
      local_28 = UVar1 | local_28;
    }
    dst_local._4_4_ = local_28;
  }
  return dst_local._4_4_;
}

Assistant:

static UA_StatusCode
DiagnosticInfo_decodeBinary(UA_DiagnosticInfo *dst, const UA_DataType *_) {
    /* Decode the encoding mask */
    UA_Byte encodingMask;
    UA_StatusCode retval = Byte_decodeBinary(&encodingMask, NULL);
    if(retval != UA_STATUSCODE_GOOD)
        return retval;

    /* Decode the content */
    if(encodingMask & 0x01) {
        dst->hasSymbolicId = true;
        retval |= Int32_decodeBinary(&dst->symbolicId);
    }
    if(encodingMask & 0x02) {
        dst->hasNamespaceUri = true;
        retval |= Int32_decodeBinary(&dst->namespaceUri);
    }
    if(encodingMask & 0x04) {
        dst->hasLocalizedText = true;
        retval |= Int32_decodeBinary(&dst->localizedText);
    }
    if(encodingMask & 0x08) {
        dst->hasLocale = true;
        retval |= Int32_decodeBinary(&dst->locale);
    }
    if(encodingMask & 0x10) {
        dst->hasAdditionalInfo = true;
        retval |= String_decodeBinary(&dst->additionalInfo, NULL);
    }
    if(encodingMask & 0x20) {
        dst->hasInnerStatusCode = true;
        retval |= StatusCode_decodeBinary(&dst->innerStatusCode);
    }
    if(encodingMask & 0x40) {
        /* innerDiagnosticInfo is allocated on the heap */
        dst->innerDiagnosticInfo = (UA_DiagnosticInfo*)UA_calloc(1, sizeof(UA_DiagnosticInfo));
        if(!dst->innerDiagnosticInfo)
            return UA_STATUSCODE_BADOUTOFMEMORY;
        dst->hasInnerDiagnosticInfo = true;
        retval |= DiagnosticInfo_decodeBinary(dst->innerDiagnosticInfo, NULL);
    }
    return retval;
}